

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O1

void __thiscall DemoM6502::DrawCode(DemoM6502 *this,int x,int y,int nLines)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  int iVar6;
  int y_00;
  bool bVar7;
  
  p_Var3 = (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &(this->mapAsm)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar7 = (ushort)(short)p_Var3[1]._M_color < (this->nes).cpu.pc;
      if (!bVar7) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar7];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var3 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = p_Var2, (this->nes).cpu.pc < (ushort)(short)p_Var2[1]._M_color)) {
    p_Var3 = &p_Var1->_M_header;
  }
  iVar6 = (nLines & 0xfffffffeU) * 5;
  y_00 = iVar6 + y;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    olc::PixelGameEngine::DrawString
              (&this->super_PixelGameEngine,x,y_00,(string *)&p_Var3[1]._M_parent,
               (Pixel)olc::CYAN.field_1,1);
    if (SBORROW4(iVar6,nLines * 10) != iVar6 + nLines * -10 < 0) {
      iVar6 = y_00;
      do {
        iVar6 = iVar6 + 10;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
        if ((_Rb_tree_header *)p_Var3 != p_Var1) {
          olc::PixelGameEngine::DrawString
                    (&this->super_PixelGameEngine,x,iVar6,(string *)&p_Var3[1]._M_parent,
                     (Pixel)olc::WHITE.field_1,1);
        }
      } while (iVar6 < nLines * 10 + y);
    }
  }
  p_Var3 = (this->mapAsm)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  if (p_Var3 != (_Base_ptr)0x0) {
    do {
      bVar7 = (ushort)*(size_t *)(p_Var3 + 1) < (this->nes).cpu.pc;
      if (!bVar7) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[bVar7];
    } while (p_Var3 != (_Base_ptr)0x0);
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var5 = p_Var4, (this->nes).cpu.pc < (ushort)(short)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if (0 < nLines >> 1 && (_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      y_00 = y_00 + -10;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5);
      if ((_Rb_tree_header *)p_Var5 != p_Var1) {
        olc::PixelGameEngine::DrawString
                  (&this->super_PixelGameEngine,x,y_00,(string *)&p_Var5[1]._M_parent,
                   (Pixel)olc::WHITE.field_1,1);
      }
    } while (y < y_00);
  }
  return;
}

Assistant:

void DrawCode(int x, int y, int nLines)
  {
    auto it_a = mapAsm.find(nes.cpu.pc);
    int nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      DrawString(x, nLineY, (*it_a).second, olc::CYAN);
      while (nLineY < (nLines * 10) + y)
      {
        nLineY += 10;
        if (++it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }

    it_a = mapAsm.find(nes.cpu.pc);
    nLineY = (nLines >> 1) * 10 + y;
    if (it_a != mapAsm.end())
    {
      while (nLineY > y)
      {
        nLineY -= 10;
        if (--it_a != mapAsm.end())
        {
          DrawString(x, nLineY, (*it_a).second);
        }
      }
    }
  }